

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimSnapshotManager.cpp
# Opt level: O2

void __thiscall OpenMD::SimSnapshotManager::~SimSnapshotManager(SimSnapshotManager *this)

{
  Snapshot *pSVar1;
  
  (this->super_SnapshotManager)._vptr_SnapshotManager =
       (_func_int **)&PTR__SimSnapshotManager_002bdaa8;
  pSVar1 = (this->super_SnapshotManager).previousSnapshot_;
  if (pSVar1 != (Snapshot *)0x0) {
    Snapshot::~Snapshot(pSVar1);
  }
  operator_delete(pSVar1,0xa98);
  pSVar1 = (this->super_SnapshotManager).currentSnapshot_;
  if (pSVar1 != (Snapshot *)0x0) {
    Snapshot::~Snapshot(pSVar1);
  }
  operator_delete(pSVar1,0xa98);
  (this->super_SnapshotManager).currentSnapshot_ = (Snapshot *)0x0;
  (this->super_SnapshotManager).previousSnapshot_ = (Snapshot *)0x0;
  SnapshotManager::~SnapshotManager(&this->super_SnapshotManager);
  return;
}

Assistant:

SimSnapshotManager::~SimSnapshotManager() {
    delete previousSnapshot_;
    delete currentSnapshot_;
    previousSnapshot_ = NULL;
    currentSnapshot_  = NULL;
  }